

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<MaterialDataV>::Resize(TPZVec<MaterialDataV> *this,int64_t newsize)

{
  double dVar1;
  MaterialDataV *pMVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  int64_t *piVar6;
  ulong uVar7;
  long lVar8;
  MaterialDataV *pMVar9;
  long lVar10;
  bool bVar11;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pMVar2 = this->fStore;
      if (pMVar2 != (MaterialDataV *)0x0) {
        dVar1 = pMVar2[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
        if (dVar1 != 0.0) {
          lVar8 = (long)dVar1 * 0x98;
          do {
            MaterialDataV::~MaterialDataV
                      ((MaterialDataV *)
                       ((long)pMVar2[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc +
                       lVar8 + -0x48));
            lVar8 = lVar8 + -0x98;
          } while (lVar8 != 0);
        }
        operator_delete__(pMVar2[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                          (long)dVar1 * 0x98 + 8);
      }
      this->fStore = (MaterialDataV *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar5 = SUB168(auVar3 * ZEXT816(0x98),0);
      uVar7 = uVar5 + 8;
      if (0xfffffffffffffff7 < uVar5) {
        uVar7 = 0xffffffffffffffff;
      }
      if (SUB168(auVar3 * ZEXT816(0x98),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      piVar6 = (int64_t *)operator_new__(uVar7);
      *piVar6 = newsize;
      pMVar2 = (MaterialDataV *)(piVar6 + 1);
      lVar8 = 0;
      pMVar9 = pMVar2;
      do {
        MaterialDataV::MaterialDataV(pMVar9);
        lVar8 = lVar8 + -0x98;
        pMVar9 = pMVar9 + 1;
      } while (newsize * -0x98 - lVar8 != 0);
      lVar8 = this->fNElements;
      if (newsize <= this->fNElements) {
        lVar8 = newsize;
      }
      lVar10 = 0;
      if (lVar8 < 1) {
        lVar8 = lVar10;
      }
      while( true ) {
        pMVar9 = this->fStore;
        bVar11 = lVar8 == 0;
        lVar8 = lVar8 + -1;
        if (bVar11) break;
        MaterialDataV::operator=
                  ((MaterialDataV *)
                   ((long)(pMVar2->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                   lVar10 + -0x48),
                   (MaterialDataV *)
                   ((long)(pMVar9->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                   lVar10 + -0x48));
        lVar10 = lVar10 + 0x98;
      }
      if (pMVar9 != (MaterialDataV *)0x0) {
        dVar1 = pMVar9[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
        if (dVar1 != 0.0) {
          lVar8 = (long)dVar1 * 0x98;
          do {
            MaterialDataV::~MaterialDataV
                      ((MaterialDataV *)
                       ((long)pMVar9[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc +
                       lVar8 + -0x48));
            lVar8 = lVar8 + -0x98;
          } while (lVar8 != 0);
        }
        operator_delete__(pMVar9[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                          (long)dVar1 * 0x98 + 8);
      }
      this->fStore = pMVar2;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}